

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void bench_ecdh_setup(void *arg)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar5;
  undefined8 *puVar6;
  ulong uVar7;
  uchar point [33];
  undefined1 auStack_110 [64];
  undefined8 *puStack_d0;
  ulong uStack_c8;
  undefined1 *puStack_c0;
  code *pcStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined1 auStack_90 [64];
  undefined1 *puVar4;
  
  *(undefined8 *)((long)arg + 0x48) = 0x807060504030201;
  *(undefined8 *)((long)arg + 0x50) = 0x100f0e0d0c0b0a09;
  *(undefined4 *)((long)arg + 0x58) = 0x14131211;
  *(undefined4 *)((long)arg + 0x5c) = 0x18171615;
  *(undefined4 *)((long)arg + 0x60) = 0x1c1b1a19;
  *(undefined4 *)((long)arg + 100) = 0x201f1e1d;
  puVar5 = *arg;
  uVar2 = (int)arg + 8;
  iVar1 = secp256k1_ec_pubkey_parse();
  if (iVar1 == 1) {
    return;
  }
  bench_ecdh_setup_cold_1();
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      uStack_b0 = CONCAT62(uStack_b0._2_6_,(short)uVar7);
      puVar6 = (undefined8 *)*puVar5;
      pcStack_b8 = (code *)0x103f59;
      puVar4 = auStack_90;
      iVar1 = secp256k1_schnorrsig_sign_custom
                        (puVar6,auStack_90,&uStack_b0,0x20,*(undefined8 *)(puVar5[2] + uVar7 * 8),0)
      ;
      uVar3 = (uint)puVar4;
      if (iVar1 == 0) {
        pcStack_b8 = bench_schnorrsig_verify;
        bench_schnorrsig_sign_cold_1();
        if ((int)uVar3 < 1) {
          return;
        }
        uVar7 = 0;
        puStack_d0 = puVar5;
        uStack_c8 = (ulong)uVar2;
        puStack_c0 = auStack_90;
        pcStack_b8 = (code *)&uStack_b0;
        goto LAB_00103f95;
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  return;
LAB_00103f95:
  iVar1 = secp256k1_xonly_pubkey_parse(*puVar6,auStack_110,*(undefined8 *)(puVar6[3] + uVar7 * 8));
  if (iVar1 != 1) {
    bench_schnorrsig_verify_cold_1();
LAB_00103fea:
    bench_schnorrsig_verify_cold_2();
    halt_baddata();
  }
  iVar1 = secp256k1_schnorrsig_verify
                    (*puVar6,*(undefined8 *)(puVar6[4] + uVar7 * 8),
                     *(undefined8 *)(puVar6[5] + uVar7 * 8),0x20,auStack_110);
  if (iVar1 == 0) goto LAB_00103fea;
  uVar7 = uVar7 + 1;
  if (uVar3 == uVar7) {
    return;
  }
  goto LAB_00103f95;
}

Assistant:

static void bench_ecdh_setup(void* arg) {
    int i;
    bench_ecdh_data *data = (bench_ecdh_data*)arg;
    const unsigned char point[] = {
        0x03,
        0x54, 0x94, 0xc1, 0x5d, 0x32, 0x09, 0x97, 0x06,
        0xc2, 0x39, 0x5f, 0x94, 0x34, 0x87, 0x45, 0xfd,
        0x75, 0x7c, 0xe3, 0x0e, 0x4e, 0x8c, 0x90, 0xfb,
        0xa2, 0xba, 0xd1, 0x84, 0xf8, 0x83, 0xc6, 0x9f
    };

    for (i = 0; i < 32; i++) {
        data->scalar[i] = i + 1;
    }
    CHECK(secp256k1_ec_pubkey_parse(data->ctx, &data->point, point, sizeof(point)) == 1);
}